

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O1

void __thiscall
duckdb::ColumnReader::PlainTemplated<bool,duckdb::TemplatedParquetValueConversion<bool>>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t result_offset,Vector *result)

{
  if ((defines != (uint8_t *)0x0) && (this->column_schema->max_define != 0)) {
    PlainTemplatedDefines<bool,duckdb::TemplatedParquetValueConversion<bool>,true>
              (this,plain_data,defines,num_values,result_offset,result);
    return;
  }
  if (plain_data->len < num_values) {
    PlainTemplatedInternal<bool,duckdb::TemplatedParquetValueConversion<bool>,false,true>
              (this,plain_data,defines,num_values,result_offset,result);
    return;
  }
  switchD_00b1522a::default(result->data + result_offset,plain_data->ptr,num_values);
  plain_data->len = plain_data->len - num_values;
  plain_data->ptr = plain_data->ptr + num_values;
  return;
}

Assistant:

void PlainTemplated(ByteBuffer &plain_data, const uint8_t *defines, uint64_t num_values, idx_t result_offset,
	                    Vector &result) {
		if (HasDefines() && defines) {
			PlainTemplatedDefines<VALUE_TYPE, CONVERSION, true>(plain_data, defines, num_values, result_offset, result);
		} else {
			PlainTemplatedDefines<VALUE_TYPE, CONVERSION, false>(plain_data, defines, num_values, result_offset,
			                                                     result);
		}
	}